

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,BlockStatement *stmt)

{
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  StatementBlockSymbol *pSVar4;
  Statement *this_00;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  size_type sVar7;
  pointer piVar8;
  bool bVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  value_type *elements;
  int iVar17;
  int iVar18;
  Statement **ppSVar19;
  int iVar20;
  value_type *elements_1;
  ulong hash;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  Statement **ppSVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  iterator pos;
  try_emplace_args_t local_a9;
  StatementSyntax *local_a8;
  StatementBlockSymbol *local_a0;
  Statement *stmtPtr;
  Statement *local_90;
  group_type_pointer local_88;
  Statement local_80;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator res;
  
  pSVar4 = stmt->blockSymbol;
  if (pSVar4 != (StatementBlockSymbol *)0x0) {
    arrays_ = &this->disableBranches;
    stmtPtr = &local_80;
    local_90 = (Statement *)0x0;
    local_88 = (group_type_pointer)0xa;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pSVar4;
    hash = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar15 = hash >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                            .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_a8 = (StatementSyntax *)
               (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
               .arrays.groups_size_mask;
    uVar22 = 0;
    uVar24 = uVar15;
    do {
      pgVar5 = (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
               .arrays.groups_ + uVar24;
      local_58 = pgVar5->m[0].n;
      uStack_57 = pgVar5->m[1].n;
      uStack_56 = pgVar5->m[2].n;
      bStack_55 = pgVar5->m[3].n;
      uStack_54 = pgVar5->m[4].n;
      uStack_53 = pgVar5->m[5].n;
      uStack_52 = pgVar5->m[6].n;
      bStack_51 = pgVar5->m[7].n;
      uStack_50 = pgVar5->m[8].n;
      uStack_4f = pgVar5->m[9].n;
      uStack_4e = pgVar5->m[10].n;
      bStack_4d = pgVar5->m[0xb].n;
      uStack_4c = pgVar5->m[0xc].n;
      uStack_4b = pgVar5->m[0xd].n;
      uStack_4a = pgVar5->m[0xe].n;
      bStack_49 = pgVar5->m[0xf].n;
      uVar26 = (uchar)uVar3;
      auVar31[0] = -(local_58 == uVar26);
      uVar27 = (uchar)((uint)uVar3 >> 8);
      auVar31[1] = -(uStack_57 == uVar27);
      uVar28 = (uchar)((uint)uVar3 >> 0x10);
      auVar31[2] = -(uStack_56 == uVar28);
      bVar29 = (byte)((uint)uVar3 >> 0x18);
      auVar31[3] = -(bStack_55 == bVar29);
      auVar31[4] = -(uStack_54 == uVar26);
      auVar31[5] = -(uStack_53 == uVar27);
      auVar31[6] = -(uStack_52 == uVar28);
      auVar31[7] = -(bStack_51 == bVar29);
      auVar31[8] = -(uStack_50 == uVar26);
      auVar31[9] = -(uStack_4f == uVar27);
      auVar31[10] = -(uStack_4e == uVar28);
      auVar31[0xb] = -(bStack_4d == bVar29);
      auVar31[0xc] = -(uStack_4c == uVar26);
      auVar31[0xd] = -(uStack_4b == uVar27);
      auVar31[0xe] = -(uStack_4a == uVar28);
      auVar31[0xf] = -(bStack_49 == bVar29);
      for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe); local_a0 = pSVar4
          , uVar21 != 0; uVar21 = uVar21 - 1 & uVar21) {
        uVar10 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        if (pSVar4 == (StatementBlockSymbol *)
                      (this->disableBranches).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                      .arrays.elements_[uVar24 * 0xf + (ulong)uVar10].first) goto LAB_001eb91e;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
      lVar23 = uVar24 + uVar22;
      uVar22 = uVar22 + 1;
      uVar24 = lVar23 + 1U & (ulong)local_a8;
    } while (uVar22 <= local_a8);
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                       *)arrays_,(arrays_type *)arrays_,uVar15,hash,&local_a9,(Symbol **)&local_a0,
                 (SmallVector<int,_10UL> *)&stmtPtr);
      psVar1 = &(this->disableBranches).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                       *)arrays_,hash,&local_a9,(Symbol **)&local_a0,
                 (SmallVector<int,_10UL> *)&stmtPtr);
    }
LAB_001eb91e:
    if (stmtPtr != &local_80) {
      operator_delete(stmtPtr);
    }
  }
  if (stmt->blockKind == Sequential) {
    ast::Statement::visit<TestAnalysis&>(stmt->body,(TestAnalysis *)this);
    goto LAB_001eba55;
  }
  stmtPtr = stmt->body;
  if (stmtPtr->kind == List) {
    ppSVar19 = *(Statement ***)(stmtPtr + 1);
    local_a8 = stmtPtr[1].syntax;
    ppSVar25 = ppSVar19 + (long)local_a8;
    if (local_a8 != (StatementSyntax *)0x0) goto LAB_001eb997;
    local_a8 = (StatementSyntax *)0x0;
    lVar23 = 0;
  }
  else {
    local_a8 = (StatementSyntax *)0x1;
    ppSVar19 = &stmtPtr;
    ppSVar25 = &local_90;
LAB_001eb997:
    lVar16 = 0;
    lVar23 = 0;
    do {
      if (ppSVar19[lVar23]->kind != VariableDeclaration) break;
      ast::Statement::visit<TestAnalysis&>(ppSVar19[lVar23],(TestAnalysis *)this);
      lVar23 = lVar23 + 1;
      lVar13 = lVar16 + 8;
      lVar16 = lVar16 + 8;
    } while ((Statement **)((long)ppSVar19 + lVar13) != ppSVar25);
  }
  iVar20 = this->state;
  local_a8 = (StatementSyntax *)((long)local_a8 - lVar23);
  iVar18 = iVar20;
  if (local_a8 != (StatementSyntax *)0x0) {
    ppSVar19 = ppSVar19 + lVar23;
    iVar17 = iVar20;
    do {
      this_00 = *ppSVar19;
      this->isStateSplit = false;
      this->state = iVar20;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      ast::Statement::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
      if (stmt->blockKind == JoinAll) {
        iVar14 = this->state;
LAB_001eba2f:
        bVar9 = iVar14 < iVar18;
        iVar18 = iVar17;
        if (bVar9) {
          iVar18 = iVar14;
          iVar17 = iVar14;
        }
      }
      else if (stmt->blockKind != JoinNone) {
        iVar14 = this->state;
        if (local_a8 == (StatementSyntax *)0x1) goto LAB_001eba2f;
        iVar18 = iVar18 + iVar14;
        iVar17 = iVar18;
      }
      ppSVar19 = ppSVar19 + 1;
    } while (ppSVar19 != ppSVar25);
  }
  this->isStateSplit = false;
  this->state = iVar18;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
LAB_001eba55:
  pSVar4 = stmt->blockSymbol;
  if (pSVar4 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = pSVar4;
  uVar15 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar24 = uVar15 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar15 & 0xff];
  ppVar6 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.elements_;
  lVar23 = 0;
  do {
    pgVar2 = pgVar5 + uVar24;
    uVar26 = (uchar)uVar3;
    auVar32[0] = -(pgVar2->m[0].n == uVar26);
    uVar27 = (uchar)((uint)uVar3 >> 8);
    auVar32[1] = -(pgVar2->m[1].n == uVar27);
    uVar28 = (uchar)((uint)uVar3 >> 0x10);
    auVar32[2] = -(pgVar2->m[2].n == uVar28);
    uVar30 = (uchar)((uint)uVar3 >> 0x18);
    auVar32[3] = -(pgVar2->m[3].n == uVar30);
    auVar32[4] = -(pgVar2->m[4].n == uVar26);
    auVar32[5] = -(pgVar2->m[5].n == uVar27);
    auVar32[6] = -(pgVar2->m[6].n == uVar28);
    auVar32[7] = -(pgVar2->m[7].n == uVar30);
    auVar32[8] = -(pgVar2->m[8].n == uVar26);
    auVar32[9] = -(pgVar2->m[9].n == uVar27);
    auVar32[10] = -(pgVar2->m[10].n == uVar28);
    auVar32[0xb] = -(pgVar2->m[0xb].n == uVar30);
    auVar32[0xc] = -(pgVar2->m[0xc].n == uVar26);
    auVar32[0xd] = -(pgVar2->m[0xd].n == uVar27);
    auVar32[0xe] = -(pgVar2->m[0xe].n == uVar28);
    auVar32[0xf] = -(pgVar2->m[0xf].n == uVar30);
    for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
        uVar21 = uVar21 - 1 & uVar21) {
      uVar10 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      uVar15 = (ulong)uVar10;
      if (pSVar4 == (StatementBlockSymbol *)ppVar6[uVar24 * 0xf + uVar15].first) {
        pos.p_ = (table_element_pointer)(pgVar5[uVar24].m + uVar15);
        sVar7 = ppVar6[uVar24 * 0xf + uVar15].second.super_SmallVectorBase<int>.len;
        if (sVar7 != 0) {
          piVar8 = ppVar6[uVar24 * 0xf + uVar15].second.super_SmallVectorBase<int>.data_;
          iVar20 = this->state;
          lVar23 = 0;
          do {
            iVar20 = iVar20 + *(int *)((long)piVar8 + lVar23);
            this->state = iVar20;
            lVar23 = lVar23 + 4;
          } while (sVar7 << 2 != lVar23);
        }
        pos.pc_ = (char_pointer)&this->disableBranches;
        boost::unordered::detail::foa::
        table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
        ::erase<false,_nullptr>
                  ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                    *)&stmtPtr,pos);
        return;
      }
    }
    lVar16 = uVar24 + lVar23;
    lVar23 = lVar23 + 1;
    uVar24 = lVar16 + 1U &
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.groups_size_mask;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }